

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

int cppcms_capi_session_load(cppcms_capi_session *session)

{
  logic_error *this;
  int iVar1;
  
  iVar1 = -1;
  if (session != (cppcms_capi_session *)0x0) {
    cppcms_capi_session::check(session);
    if (session->loaded == true) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"Session is already loaded");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    cppcms::session_interface::load((session->p).ptr_);
    session->loaded = true;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cppcms_capi_session_load(cppcms_capi_session *session)
{
	TRY {
		if(!session)
			return -1;
		session->check();
		if(session->loaded) {
			throw std::logic_error("Session is already loaded");
		}
		session->p->load();
		session->loaded = true;
	}